

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.cpp
# Opt level: O0

string * findTestDir_abi_cxx11_(void)

{
  int iVar1;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000018;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000020;
  
  if (findTestDir[abi:cxx11]()::path_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&findTestDir[abi:cxx11]()::path_abi_cxx11_);
    if (iVar1 != 0) {
      findTestDirInternal_abi_cxx11_();
      __cxa_atexit(std::__cxx11::string::~string,&findTestDir[abi:cxx11]()::path_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&findTestDir[abi:cxx11]()::path_abi_cxx11_);
    }
  }
  std::__cxx11::string::string(in_stack_00000020,in_stack_00000018);
  return in_RDI;
}

Assistant:

std::string findTestDir() {
    static auto path = findTestDirInternal();
    return path;
}